

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O2

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* solver2Q1L<double>(vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                     *__return_storage_ptr__,
                    vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    *ptPair,vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                            *plPair,
                    vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    *lPair,vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                           *lCPair)

{
  pointer src;
  double dVar1;
  ulong uVar2;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  pointer pMVar7;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar8;
  byte bVar9;
  double dVar10;
  double dVar11;
  Scalar local_930;
  double local_928;
  vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>> *local_920
  ;
  undefined1 local_918 [16];
  double local_908;
  undefined8 uStack_900;
  double local_8f8;
  Scalar local_8f0;
  Scalar local_8e8;
  Scalar local_8e0;
  Scalar local_8d8;
  Scalar local_8d0;
  Scalar local_8c8;
  Scalar local_8c0;
  Scalar local_8b8;
  Scalar local_8b0;
  Scalar local_8a8;
  double local_8a0;
  double local_898;
  _Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_890;
  Matrix<double,_6,_1,_0,_6,_1> L2_2;
  Matrix<double,_6,_1,_0,_6,_1> L1_2;
  undefined1 local_800 [16];
  Matrix<double,_4,_4,_0,_4,_4> *local_7f0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_7d0;
  double local_7a8;
  undefined8 uStack_7a0;
  Matrix<double,_4,_4,_0,_4,_4> TF1;
  Matrix<double,_4,_1,_0,_4,_1> P2;
  Matrix<double,_4,_1,_0,_4,_1> P1;
  Matrix<double,_3,_1,_0,_3,_1> tQ2;
  Matrix<double,_3,_1,_0,_3,_1> tQ1;
  Matrix<double,_3,_1,_0,_3,_1> tP2;
  Matrix<double,_3,_1,_0,_3,_1> tP1;
  Matrix<double,_4,_4,_0,_4,_4> TF2;
  Matrix<double,_4,_1,_0,_4,_1> Q2;
  Matrix<double,_4,_1,_0,_4,_1> P2_B;
  Matrix<double,_4,_1,_0,_4,_1> P1_B;
  Matrix<double,_6,_6,_0,_6,_6> transLineU;
  Matrix<double,_6,_1,_0,_6,_1> L2;
  Matrix<double,_6,_1,_0,_6,_1> L1;
  Matrix<double,_3,_1,_0,_3,_1> local_418;
  Matrix<double,_3,_1,_0,_3,_1> local_400;
  Matrix<double,_3,_1,_0,_3,_1> D2;
  Matrix<double,_3,_1,_0,_3,_1> D1;
  Matrix<double,_4,_4,_0,_4,_4> local_3b8;
  Matrix<double,_6,_6,_0,_6,_6> transLineV;
  Matrix<double,_4,_1,_0,_4,_1> R2_B;
  Matrix<double,_4,_1,_0,_4,_1> R1_B;
  Matrix<double,_4,_1,_0,_4,_1> Q1;
  Matrix<double,_4,_4,_0,_4,_4> TU;
  Matrix<double,_4,_4,_0,_4,_4> TV;
  Matrix<double,_4,_1,_0,_4,_1> local_b8;
  Matrix<double,_4,_1,_0,_4,_1> local_98;
  Matrix<double,_4,_1,_0,_4,_1> local_78;
  Matrix<double,_4,_1,_0,_4,_1> local_58;
  
  bVar9 = 0;
  src = (ptPair->
        super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if ((0x40 < (ulong)((long)(ptPair->
                            super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)src)) &&
     ((lPair->
      super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (lPair->
      super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start)) {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&P1,&src->first);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&P1_B,&((ptPair->
                       super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->second);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&P2,&(ptPair->
                    super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[1].first);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&P2_B,&(ptPair->
                      super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[1].second);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&Q1,(Matrix<double,_4,_1,_0,_4,_1> *)
                   (lPair->
                   super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&Q2,&(((lPair->
                      super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->first).second);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&R1_B,&(((lPair->
                        super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->second).first);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&R2_B,&(((lPair->
                        super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->second).second);
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_920 = (vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                 *)__return_storage_ptr__;
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&transLineV,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&Q1,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&transLineU,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&transLineV,
               P1.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tP1,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                     *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&transLineV,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&Q2,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&transLineU,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&transLineV,
               P2.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tP2,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                     *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&transLineV,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&R1_B,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&transLineU,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&transLineV,
               Q1.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tQ1,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                     *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&transLineV,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&R2_B,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&transLineU,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&transLineV,
               Q2.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tQ2,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                     *)&transLineU);
    transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = (double)&tP2;
    transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [1] = (double)&tP1;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&D1,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L1,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&transLineU,&D1);
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = tP1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
          * tP2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
            [1] - tP2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[2] *
                  tP1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[1];
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [1] = tP1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
          * tP2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
            [2] - tP2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[0] *
                  tP1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[2];
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [2] = tP2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
          * tP1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
            [1] - tP1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[0] *
                  tP2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[1];
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L1,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&transLineU,
               (Matrix<double,_3,_1,_0,_3,_1> *)&transLineV);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L1,3);
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                      *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L1,(Scalar *)&transLineV);
    transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = (double)&tQ2;
    transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [1] = (double)&tQ1;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&D2,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L2,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&transLineU,&D2);
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = tQ1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
          * tQ2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
            [1] - tQ2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[2] *
                  tQ1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[1];
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [1] = tQ1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
          * tQ2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
            [2] - tQ2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[0] *
                  tQ1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[2];
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [2] = tQ2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
          * tQ1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
            [1] - tQ1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[0] *
                  tQ2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[1];
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L2,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&transLineU,
               (Matrix<double,_3,_1,_0,_3,_1> *)&transLineV);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&transLineU,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L2,3);
    transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
    [0] = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                      *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L2,(Scalar *)&transLineV);
    local_58.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = P1.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
    ;
    local_58.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
         = P1.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
    ;
    local_58.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
         = P1.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
    ;
    local_58.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
         = P1.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
    ;
    local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = P2.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
    ;
    local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
         = P2.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
    ;
    local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
         = P2.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
    ;
    local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
         = P2.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
    ;
    local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = P1_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
           [0];
    local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
         = P1_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
           [1];
    local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
         = P1_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
           [2];
    local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
         = P1_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
           [3];
    local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = P2_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
           [0];
    local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
         = P2_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
           [1];
    local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
         = P2_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
           [2];
    local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
         = P2_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
           [3];
    getPredefinedTransformations2Points1Line<double>
              ((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                *)&local_890,&local_58,&local_78,&local_98,&local_b8);
    lVar6 = 0x10;
    pMVar7 = local_890._M_impl.super__Vector_impl_data._M_finish + -1;
    pMVar8 = &TV;
    for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
      [0] = (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[0];
      pMVar7 = (pointer)((long)pMVar7 + ((ulong)bVar9 * -2 + 1) * 8);
      pMVar8 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar8 + ((ulong)bVar9 * -2 + 1) * 8);
    }
    local_890._M_impl.super__Vector_impl_data._M_finish =
         local_890._M_impl.super__Vector_impl_data._M_finish + -2;
    pMVar7 = local_890._M_impl.super__Vector_impl_data._M_finish;
    pMVar8 = &TU;
    for (; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
      [0] = (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[0];
      pMVar7 = (pointer)((long)pMVar7 + ((ulong)bVar9 * -2 + 1) * 8);
      pMVar8 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar8 + ((ulong)bVar9 * -2 + 1) * 8);
    }
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)&transLineU);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)&transLineV);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&TF1,&TU,3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>
              ((Type *)&TF2,&transLineU,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TF2,
               (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TF1);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&TF1,&TU,3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomRightCorner<int,int>
              ((Type *)&TF2,&transLineU,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TF2,
               (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TF1);
    local_930._0_4_ = 0xffffffff;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true> *)
                    local_800,&TU,3);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
              ((Type *)&TF2,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)
               local_800,3);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_400,
               (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                *)&TF2);
    getSkew<double>((Matrix<double,_3,_3,_0,_3,_3> *)&local_3b8,&local_400);
    Eigen::operator*(&local_7d0,(int *)&local_930,(StorageBaseType *)&local_3b8);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&L1_2,&TU,3,3)
    ;
    Eigen::
    Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_0>
    ::Product((Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
               *)&TF1,&local_7d0,(Rhs *)&L1_2);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomLeftCorner<int,int>
              ((Type *)&L2_2,&transLineU,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&L2_2,
               (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)&TF1);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&TF1,&TV,3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>
              ((Type *)&TF2,&transLineV,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TF2,
               (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TF1);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&TF1,&TV,3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomRightCorner<int,int>
              ((Type *)&TF2,&transLineV,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TF2,
               (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TF1);
    local_930 = (Scalar)CONCAT44(local_930._4_4_,0xffffffff);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true> *)
                    local_800,&TV,3);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
              ((Type *)&TF2,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)
               local_800,3);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_418,
               (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                *)&TF2);
    getSkew<double>((Matrix<double,_3,_3,_0,_3,_3> *)&local_3b8,&local_418);
    Eigen::operator*(&local_7d0,(int *)&local_930,(StorageBaseType *)&local_3b8);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&L1_2,&TV,3,3)
    ;
    Eigen::
    Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_0>
    ::Product((Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
               *)&TF1,&local_7d0,(Rhs *)&L1_2);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomLeftCorner<int,int>
              ((Type *)&L2_2,&transLineV,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&L2_2,
               (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)&TF1);
    TF1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         (double)&transLineU;
    TF1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
         (double)&L1;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (&L1_2,(Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                      *)&TF1);
    TF1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         (double)&transLineV;
    TF1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
         (double)&L2;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (&L2_2,(Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                      *)&TF1);
    Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setIdentity
              ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&TF1,4,4);
    Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setIdentity
              ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&TF2,4,4);
    dVar11 = ((((L1_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[2] *
                 L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[5] -
                L1_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3] *
                L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0]) -
               L1_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[1] *
               L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[4]) -
              L1_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4] *
              L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1]) -
             L1_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[0] *
             L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[3]) +
             L1_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[5] *
             L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[2];
    local_7a8 = L1_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[4] * -2.0 *
                L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] +
                (L1_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[3] +
                L1_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3]) *
                L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] +
                (L1_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] +
                L1_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0]) *
                L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[4] +
                L1_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] * -2.0 *
                L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3];
    uVar2 = (ulong)DAT_003ba0b0 ^ (ulong)local_7a8;
    local_918._0_4_ = (undefined4)uVar2;
    local_918._4_4_ = (undefined4)(uVar2 >> 0x20);
    local_918._8_4_ = DAT_003ba0b0._8_4_;
    local_918._12_4_ = DAT_003ba0b0._12_4_;
    uStack_7a0 = 0;
    dVar10 = local_7a8 * local_7a8 +
             dVar11 * -4.0 *
             (L1_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[0] *
              L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[3] +
              L1_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1] *
              L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4] +
              L1_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[2] *
              L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[5] +
              L1_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[3] *
              L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[0] +
              L1_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[4] *
              L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array[1] +
             L1_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[5] *
             L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
             array[2]);
    dVar1 = SQRT(dVar10);
    local_928 = dVar1;
    if (dVar10 < 0.0) {
      local_918._0_8_ = uVar2;
      uStack_900 = 0;
      local_908 = dVar10;
      dVar1 = sqrt(dVar10);
      dVar10 = local_908;
    }
    dVar1 = ((double)CONCAT44(local_918._4_4_,local_918._0_4_) - dVar1) / (dVar11 + dVar11);
    local_918._0_8_ = dVar1;
    if (dVar10 < 0.0) {
      local_928 = sqrt(dVar10);
      dVar1 = (double)local_918._0_8_;
    }
    if (!NAN(dVar1)) {
      local_8f8 = dVar1 * dVar1 + 1.0;
      local_908 = (1.0 - dVar1 * dVar1) / local_8f8;
      local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [1] = 0.0;
      local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [2] = 4.94065645841247e-324;
      local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [3] = 4.94065645841247e-324;
      local_800._0_8_ = (dVar1 * -2.0) / local_8f8;
      TF1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
           local_908;
      local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = (double)&TF1;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_3b8,
                          (Scalar *)local_800);
      local_7d0._0_8_ = 0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,(Scalar *)&local_7d0);
      local_930 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_930);
      local_898 = ((double)local_918._0_8_ + (double)local_918._0_8_) / local_8f8;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_898);
      local_8a0 = local_908;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_8a0);
      local_8a8 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_8a8);
      local_8b0 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_8b0);
      local_8b8 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_8b8);
      local_8c0 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_8c0);
      local_8c8 = 1.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_8c8);
      local_8d0 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_8d0);
      local_8d8 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_8d8);
      local_8e0 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_8e0);
      local_8e8 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_8e8);
      local_8f0 = 1.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_(pCVar3,&local_8f0);
      Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::finished
                ((CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_3b8);
      local_7f0 = &TU;
      local_800._0_8_ = &TV;
      local_800._8_8_ = (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&TF1;
      Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
      _set_noalias<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> *)&local_3b8,
                 (DenseBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
                  *)local_800);
      std::vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>::
      emplace_back<Eigen::Matrix<double,4,4,0,4,4>>(local_920,&local_3b8);
      local_928 = (local_928 - local_7a8) / (dVar11 + dVar11);
      dVar10 = local_928 * local_928 + 1.0;
      dVar1 = (1.0 - local_928 * local_928) / dVar10;
      local_918._0_8_ = dVar10;
      local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [1] = 0.0;
      local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [2] = 4.94065645841247e-324;
      local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [3] = 4.94065645841247e-324;
      local_800._0_8_ = (local_928 * -2.0) / dVar10;
      TF2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
           dVar1;
      local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = (double)&TF2;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_3b8,
                          (Scalar *)local_800);
      local_7d0._0_8_ = 0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,(Scalar *)&local_7d0);
      local_930 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_930);
      local_898 = (local_928 + local_928) / (double)local_918._0_8_;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_898);
      local_8a0 = dVar1;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_8a0);
      local_8a8 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_8a8);
      local_8b0 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_8b0);
      local_8b8 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_8b8);
      local_8c0 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_8c0);
      local_8c8 = 1.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_8c8);
      local_8d0 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_8d0);
      local_8d8 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_8d8);
      local_8e0 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_8e0);
      local_8e8 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar3,&local_8e8);
      local_8f0 = 1.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_(pCVar3,&local_8f0);
      Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::finished
                ((CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_3b8);
      __return_storage_ptr__ =
           (vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
            *)local_920;
      local_7f0 = &TU;
      local_800._0_8_ = &TV;
      local_800._8_8_ = &TF2;
      Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
      _set_noalias<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> *)&local_3b8,
                 (DenseBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
                  *)local_800);
      std::vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>::
      emplace_back<Eigen::Matrix<double,4,4,0,4,4>>
                ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                  *)__return_storage_ptr__,&local_3b8);
    }
    std::
    _Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::~_Vector_base(&local_890);
    return (vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
            *)(vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
               *)__return_storage_ptr__;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,
                           "Solver 2Q 1L requires at least 2 point and 1 line pairs!");
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(-1);
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> solver2Q1L(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair)
{
	// check input vectors size
	if(ptPair.size() < 2 || lPair.size() < 1){
		std::cerr << "Solver 2Q 1L requires at least 2 point and 1 line pairs!" << std::endl;
		exit(-1);
	}

	// parse inputs
	Eigen::Matrix<floatPrec,4,1> P1,P1_B,P2,P2_B,Q1,Q2,R1_B,R2_B;
	P1 = ptPair[0].first; P1_B = ptPair[0].second;
	P2 = ptPair[1].first; P2_B = ptPair[1].second;

	Q1 = lPair[0].first.first; Q2 = lPair[0].first.second;
	R1_B = lPair[0].second.first; R2_B = lPair[0].second.second;

	// initialize the transformation matrix
	vector<Matrix<floatPrec, 4,4>> out;

	Matrix<floatPrec, 3,1> tP1, tP2, tQ1, tQ2;
	tP1 = Q1.head(3) / P1(3);
	tP2 = Q2.head(3) / P2(3);
	tQ1 = R1_B.head(3) / Q1(3);
	tQ2 = R2_B.head(3) / Q2(3);

	// computing the plucker coordinates of the lines
	// starting from line 1
	Matrix<floatPrec, 3,1> D1 = tP2 - tP1;
	Matrix<floatPrec, 6,1> L1;
	L1.head(3) = D1;
	L1.tail(3) = tP2.cross(tP1);
	L1 /= L1.head(3).norm();
	// starting from line 2
	Matrix<floatPrec, 3,1> D2 = tQ2 - tQ1;
	Matrix<floatPrec, 6,1> L2;
	L2.head(3) = D2;
	L2.tail(3) = tQ2.cross(tQ1);
	L2 /= L2.head(3).norm();

	// compute predefined transformations
	vector<Matrix<floatPrec, 4,4>> predTrans = getPredefinedTransformations2Points1Line<floatPrec>(P1, P2, P1_B, P2_B);
	Matrix<floatPrec, 4,4> TV = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4,4> TU = predTrans.back();
	predTrans.pop_back();

	// transform lines to predefined frames
	Matrix<floatPrec, 6,6> transLineU, transLineV;
	transLineU.setZero();
	transLineV.setZero();
	transLineU.topLeftCorner(3, 3) = TU.topLeftCorner(3, 3);
	transLineU.bottomRightCorner(3, 3) = TU.topLeftCorner(3, 3);
	transLineU.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TU.col(3).head(3)) * TU.topLeftCorner(3, 3);
	transLineV.topLeftCorner(3, 3) = TV.topLeftCorner(3, 3);
	transLineV.bottomRightCorner(3, 3) = TV.topLeftCorner(3, 3);
	transLineV.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TV.col(3).head(3)) * TV.topLeftCorner(3, 3);

	Matrix<floatPrec, 6,1> L1_2, L2_2;
	L1_2 = transLineU * L1;
	L2_2 = transLineV * L2;

	// compute rotation around Z axis
	// initialize two transformation solutions
	Matrix<floatPrec, 4,4> TF1, TF2;
	TF1.setIdentity(4,4);
	TF2.setIdentity(4,4);

	// compute polynomial coefficients
	floatPrec l11, l12, l13, l14, l15, l16, l21, l22, l23, l24, l25, l26;
	l11 = L1_2[0];
	l12 = L1_2[1];
	l13 = L1_2[2];
	l14 = L1_2[3];
	l15 = L1_2[4];
	l16 = L1_2[5];
	l21 = L2_2[0];
	l22 = L2_2[1];
	l23 = L2_2[2];
	l24 = L2_2[3];
	l25 = L2_2[4];
	l26 = L2_2[5];
	floatPrec a, b, c;
	a = l13 * l26 - l14 * l21 - l12 * l25 - l15 * l22 - l11 * l24 + l16 * l23;
	b = 2 * l11 * l25 - 2 * l12 * l24 + 2 * l14 * l22 - 2 * l15 * l21;
	c = l11 * l24 + l12 * l25 + l13 * l26 + l14 * l21 + l15 * l22 + l16 * l23;

	// apply quadratic formula
	floatPrec s1, s2;
	s1 = (-b - sqrt(b * b - 4 * a * c)) / (2 * a);
	s2 = (-b + sqrt(b * b - 4 * a * c)) / (2 * a);

	if(!isnan(s1)){
		TF1 << (1 - s1 * s1) / (1 + s1 * s1), -2 * s1 / (1 + s1 * s1), 0, 0,
			2 * s1 / (1 + s1 * s1), (1 - s1 * s1) / (1 + s1 * s1), 0, 0,
			0, 0, 1, 0,
			0, 0, 0, 1;
		out.push_back(TV.inverse() * TF1 * TU);
		TF2 << (1 - s2 * s2) / (1 + s2 * s2), -2 * s2 / (1 + s2 * s2), 0, 0,
			2 * s2 / (1 + s2 * s2), (1 - s2 * s2) / (1 + s2 * s2), 0, 0,
			0, 0, 1, 0,
			0, 0, 0, 1;
		out.push_back(TV.inverse() * TF2 * TU);
	}

	return out;
}